

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O2

void __thiscall
duckdb::StrfTimeFormat::ConvertDateVector
          (StrfTimeFormat *this,Vector *input,Vector *result,idx_t count)

{
  anon_union_16_2_67f50693_for_value *paVar1;
  int32_t *piVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  ulong uVar5;
  sel_t *dataptr;
  ulong uVar6;
  void *dataptr_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *other;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t extraout_RDX_01;
  idx_t idx;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  data_ptr_t pdVar11;
  idx_t *piVar12;
  ulong uVar13;
  idx_t iVar14;
  ulong uVar15;
  string_t sVar16;
  anon_struct_16_3_d7536bce_for_pointer aVar17;
  ValidityMask local_a8;
  ulong local_88;
  data_ptr_t local_80;
  UnifiedVectorFormat local_78;
  
  local_a8.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)this;
  local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)result;
  if (input->vector_type == FLAT_VECTOR) {
    dataptr_00 = (void *)count;
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar11 = result->data;
    pdVar4 = input->data;
    FlatVector::VerifyFlatVector(input);
    FlatVector::VerifyFlatVector(result);
    if ((input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      piVar12 = (idx_t *)(pdVar11 + 8);
      iVar14 = extraout_RDX;
      for (iVar9 = 0; count != iVar9; iVar9 = iVar9 + 1) {
        sVar16 = UnaryLambdaWrapperWithNulls::
                 Operation<duckdb::StrfTimeFormat::ConvertDateVector(duckdb::Vector&,duckdb::Vector&,unsigned_long)::__0,duckdb::date_t,duckdb::string_t>
                           ((date_t)*(int32_t *)(pdVar4 + iVar9 * 4),&local_a8,iVar14,dataptr_00);
        iVar14 = sVar16.value._8_8_;
        piVar12[-1] = sVar16.value._0_8_;
        *piVar12 = iVar14;
        piVar12 = piVar12 + 2;
      }
    }
    else {
      other = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&input->validity;
      TemplatedValidityMask<unsigned_long>::Copy
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                 (TemplatedValidityMask<unsigned_long> *)other,count);
      local_88 = count + 0x3f >> 6;
      iVar14 = extraout_RDX_00;
      uVar13 = 0;
      local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = other;
      for (uVar10 = 0; uVar10 != local_88; uVar10 = uVar10 + 1) {
        puVar3 = ((TemplatedValidityMask<unsigned_long> *)&other->_vptr__Sp_counted_base)->
                 validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          uVar8 = uVar13 + 0x40;
          if (count <= uVar13 + 0x40) {
            uVar8 = count;
          }
LAB_0084e5b6:
          piVar12 = (idx_t *)(pdVar11 + uVar13 * 0x10 + 8);
          for (; uVar6 = uVar13,
              _Var7._M_pi = local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.
                            internal.
                            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi, uVar13 < uVar8; uVar13 = uVar13 + 1) {
            sVar16 = UnaryLambdaWrapperWithNulls::
                     Operation<duckdb::StrfTimeFormat::ConvertDateVector(duckdb::Vector&,duckdb::Vector&,unsigned_long)::__0,duckdb::date_t,duckdb::string_t>
                               ((date_t)*(int32_t *)(pdVar4 + uVar13 * 4),&local_a8,iVar14,other);
            iVar14 = sVar16.value._8_8_;
            piVar12[-1] = sVar16.value._0_8_;
            *piVar12 = iVar14;
            piVar12 = piVar12 + 2;
          }
        }
        else {
          uVar5 = puVar3[uVar10];
          uVar8 = uVar13 + 0x40;
          if (count <= uVar13 + 0x40) {
            uVar8 = count;
          }
          if (uVar5 == 0xffffffffffffffff) goto LAB_0084e5b6;
          uVar6 = uVar8;
          _Var7._M_pi = other;
          if (uVar5 != 0) {
            piVar12 = (idx_t *)(pdVar11 + uVar13 * 0x10 + 8);
            local_80 = pdVar4 + uVar13 * 4;
            local_a8.super_TemplatedValidityMask<unsigned_long>.capacity = uVar10;
            for (uVar15 = 0; uVar6 = uVar13 + uVar15,
                _Var7._M_pi = local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.
                              internal.
                              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi,
                uVar10 = local_a8.super_TemplatedValidityMask<unsigned_long>.capacity,
                uVar13 + uVar15 < uVar8; uVar15 = uVar15 + 1) {
              if ((uVar5 >> (uVar15 & 0x3f) & 1) != 0) {
                sVar16 = UnaryLambdaWrapperWithNulls::
                         Operation<duckdb::StrfTimeFormat::ConvertDateVector(duckdb::Vector&,duckdb::Vector&,unsigned_long)::__0,duckdb::date_t,duckdb::string_t>
                                   ((date_t)*(int32_t *)(local_80 + uVar15 * 4),&local_a8,iVar14,
                                    other);
                iVar14 = sVar16.value._8_8_;
                piVar12[-1] = sVar16.value._0_8_;
                *piVar12 = iVar14;
              }
              piVar12 = piVar12 + 2;
            }
          }
        }
        other = _Var7._M_pi;
        uVar13 = uVar6;
      }
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    paVar1 = (anon_union_16_2_67f50693_for_value *)result->data;
    piVar2 = (int32_t *)input->data;
    puVar3 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    aVar17 = (anon_struct_16_3_d7536bce_for_pointer)
             UnaryLambdaWrapperWithNulls::
             Operation<duckdb::StrfTimeFormat::ConvertDateVector(duckdb::Vector&,duckdb::Vector&,unsigned_long)::__0,duckdb::date_t,duckdb::string_t>
                       ((date_t)*piVar2,&local_a8,idx,(void *)count);
    paVar1->pointer = aVar17;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar11 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      piVar12 = (idx_t *)(pdVar11 + 8);
      iVar14 = extraout_RDX_01;
      for (uVar10 = 0; count != uVar10; uVar10 = uVar10 + 1) {
        dataptr = (local_78.sel)->sel_vector;
        uVar13 = uVar10;
        if (dataptr != (sel_t *)0x0) {
          uVar13 = (ulong)dataptr[uVar10];
        }
        sVar16 = UnaryLambdaWrapperWithNulls::
                 Operation<duckdb::StrfTimeFormat::ConvertDateVector(duckdb::Vector&,duckdb::Vector&,unsigned_long)::__0,duckdb::date_t,duckdb::string_t>
                           ((date_t)*(int32_t *)(local_78.data + uVar13 * 4),&local_a8,iVar14,
                            dataptr);
        iVar14 = sVar16.value._8_8_;
        piVar12[-1] = sVar16.value._0_8_;
        *piVar12 = iVar14;
        piVar12 = piVar12 + 2;
      }
    }
    else {
      pdVar11 = pdVar11 + 8;
      for (iVar14 = 0; count != iVar14; iVar14 = iVar14 + 1) {
        iVar9 = iVar14;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          iVar9 = (idx_t)(local_78.sel)->sel_vector[iVar14];
        }
        if (((ulong)local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar9 >> 6] >> (iVar9 & 0x3f) & 1) == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar14);
        }
        else {
          sVar16 = UnaryLambdaWrapperWithNulls::
                   Operation<duckdb::StrfTimeFormat::ConvertDateVector(duckdb::Vector&,duckdb::Vector&,unsigned_long)::__0,duckdb::date_t,duckdb::string_t>
                             ((date_t)*(int32_t *)(local_78.data + iVar9 * 4),&local_a8,iVar9 >> 6,
                              (void *)local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                                      validity_mask[iVar9 >> 6]);
          *(long *)(pdVar11 + -8) = sVar16.value._0_8_;
          *(long *)pdVar11 = sVar16.value._8_8_;
        }
        pdVar11 = pdVar11 + 0x10;
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  }
  return;
}

Assistant:

void StrfTimeFormat::ConvertDateVector(Vector &input, Vector &result, idx_t count) {
	D_ASSERT(input.GetType().id() == LogicalTypeId::DATE);
	D_ASSERT(result.GetType().id() == LogicalTypeId::VARCHAR);
	UnaryExecutor::ExecuteWithNulls<date_t, string_t>(
	    input, result, count, [&](date_t input, ValidityMask &mask, idx_t idx) {
		    if (Date::IsFinite(input)) {
			    dtime_t time(0);
			    idx_t len = GetLength(input, time, 0, nullptr);
			    string_t target = StringVector::EmptyString(result, len);
			    FormatString(input, time, target.GetDataWriteable());
			    target.Finalize();
			    return target;
		    } else {
			    return StringVector::AddString(result, Date::ToString(input));
		    }
	    });
}